

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O3

void fs_get_field_size(void *serializer,char *name,int name_length,int *isize,int *jsize,int *ksize,
                      int *lsize)

{
  DataFieldInfo *pDVar1;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,name,name + name_length);
  pDVar1 = ser::Serializer::FindField((Serializer *)serializer,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  *isize = pDVar1->iSize_;
  *jsize = pDVar1->jSize_;
  *ksize = pDVar1->kSize_;
  *lsize = pDVar1->lSize_;
  return;
}

Assistant:

void fs_get_field_size(void* serializer, const char* name, int name_length,
                       int* isize, int* jsize, int* ksize, int* lsize)
{
    const DataFieldInfo& fieldinfo = reinterpret_cast<const Serializer*>(serializer)->FindField(std::string(name, name_length));
    *isize = fieldinfo.iSize();
    *jsize = fieldinfo.jSize();
    *ksize = fieldinfo.kSize();
    *lsize = fieldinfo.lSize();
}